

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  AcceptingStates AVar2;
  ulong uVar3;
  socklen_t __len_00;
  error_code ec;
  AcceptingStates exp;
  AcceptingStates in_stack_ffffffffffffff3c;
  error_code *in_stack_ffffffffffffff40;
  string *message;
  int logLevel;
  memory_order in_stack_ffffffffffffff50;
  AcceptingStates in_stack_ffffffffffffff54;
  error_code *in_stack_ffffffffffffff58;
  atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  error_code local_28;
  undefined4 local_14;
  TcpAcceptor *local_10;
  bool local_1;
  
  local_14 = 0;
  __len_00 = 5;
  local_10 = this;
  bVar1 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::compare_exchange_strong
                    (in_stack_ffffffffffffff60,(AcceptingStates *)in_stack_ffffffffffffff58,
                     in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
  if (bVar1) {
    CLI::std::error_code::error_code(in_stack_ffffffffffffff40);
    asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::bind
              (&this->acceptor_,(int)this + 0x10,(sockaddr *)&local_28,__len_00);
    logLevel = (int)((ulong)this >> 0x20);
    bVar1 = std::error_code::operator_cast_to_bool(&local_28);
    if (bVar1) {
      std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::operator=
                ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)in_stack_ffffffffffffff40
                 ,in_stack_ffffffffffffff3c);
      message = (string *)&stack0xffffffffffffff87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
                 (allocator<char> *)in_stack_ffffffffffffff70);
      std::error_code::message_abi_cxx11_(in_stack_ffffffffffffff58);
      std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      logger((TcpAcceptor *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),logLevel,
             message);
      std::__cxx11::string::~string(message);
      std::__cxx11::string::~string(message);
      std::__cxx11::string::~string(message);
      uVar3 = std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      local_1 = false;
    }
    else {
      AVar2 = std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::operator=
                        ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)
                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      uVar3 = (ulong)AVar2;
      local_1 = true;
    }
  }
  else {
    AVar2 = std::atomic::operator_cast_to_AcceptingStates
                      ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)0x72fed2);
    local_1 = AVar2 == CONNECTED;
    uVar3 = (ulong)CONCAT31((int3)(AVar2 >> 8),local_1);
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool TcpAcceptor::connect()
{
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        std::error_code ec;
        acceptor_.bind(endpoint_, ec);
        if (ec) {
            state = AcceptingStates::OPENED;
            logger(0, std::string("acceptor error") + ec.message());
            return false;
        }
        state = AcceptingStates::CONNECTED;
        return true;
    }
    return (state == AcceptingStates::CONNECTED);
}